

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

void __thiscall
SQASTWritingVisitor::writeExprVector
          (SQASTWritingVisitor *this,ArenaVector<SQCompilation::Expr_*> *v)

{
  uint uVar1;
  Expr **ppEVar2;
  long lVar3;
  
  OutputStream::writeVaruint(this->stream,(ulong)v->_size);
  ppEVar2 = v->_vals;
  uVar1 = v->_size;
  for (lVar3 = 0; (ulong)uVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
    SQCompilation::Node::visit<SQASTWritingVisitor>(*(Node **)((long)ppEVar2 + lVar3),this);
  }
  return;
}

Assistant:

void SQASTWritingVisitor::writeExprVector(const ArenaVector<Expr *> &v) {
  stream->writeUInt64(v.size());

  for (auto e : v) {
    e->visit(this);
  }
}